

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall
dxil_spv::Converter::Impl::emit_execution_modes_node_output(Impl *this,MDNode *output)

{
  pointer *ppNVar1;
  iterator __position;
  uint32_t uVar2;
  Id typeId;
  uint uVar3;
  MetadataKind MVar4;
  int iVar5;
  uint uVar6;
  Builder *pBVar7;
  MDNode *node;
  LoggingCallback p_Var8;
  void *pvVar9;
  uint uVar10;
  uint index;
  bool bVar12;
  bool is_rw_sharing;
  NodeOutputMeta output_meta;
  String name;
  bool local_1059;
  NodeOutputMeta local_1058;
  Impl *local_1048;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *local_1040;
  String local_1038 [128];
  ulong uVar11;
  
  local_1058.is_recursive = false;
  local_1058._9_3_ = 0;
  local_1058.spec_constant_node_index = 0;
  local_1058.payload_stride = 0;
  uVar2 = node_parse_payload_stride(output,&local_1059);
  local_1058.payload_stride = uVar2;
  pBVar7 = SPIRVModule::get_builder(this->spirv_module);
  index = 0;
  typeId = spv::Builder::makeIntegerType(pBVar7,0x20,false);
  local_1058.spec_constant_node_index = spv::Builder::makeIntConstant(pBVar7,typeId,0,true);
  pBVar7 = SPIRVModule::get_builder(this->spirv_module);
  uVar10 = (int)((ulong)((long)(this->node_outputs).
                               super__Vector_base<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->node_outputs).
                              super__Vector_base<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 + 100;
  uVar11 = (ulong)uVar10;
  local_1048 = this;
  spv::Builder::addDecoration(pBVar7,local_1058.spec_constant_node_index,DecorationSpecId,uVar10);
  uVar10 = LLVMBC::MDNode::getNumOperands(output);
  if (uVar10 != 0) {
    local_1040 = &(local_1048->node_input).node_id;
    do {
      uVar3 = get_constant_metadata<unsigned_int>(output,index);
      if (uVar3 == 0) {
        node = (MDNode *)LLVMBC::MDNode::getOperand(output,index + 1);
        MVar4 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)node);
        if (MVar4 != Node) {
          p_Var8 = get_thread_log_callback();
          if (p_Var8 == (LoggingCallback)0x0) {
            emit_execution_modes_node_output();
            std::terminate();
          }
          local_1038[0].field_2._M_allocated_capacity._0_5_ = 0x6163206e69;
          local_1038[0].field_2._5_1_ = 's';
          local_1038[0].field_2._6_1_ = 't';
          local_1038[0].field_2._7_1_ = '<';
          local_1038[0].field_2._8_1_ = 'T';
          local_1038[0].field_2._9_1_ = '>';
          local_1038[0].field_2._10_1_ = '.';
          local_1038[0].field_2._11_1_ = '\n';
          local_1038[0].field_2._12_1_ = '\0';
          local_1038[0]._M_dataplus._M_p = (pointer)0x2064696c61766e49;
          local_1038[0]._M_string_length._0_5_ = 0x2065707974;
          local_1038[0]._M_string_length._5_3_ = 0x204449;
          pvVar9 = get_thread_log_callback_userdata();
          (*p_Var8)(pvVar9,Error,(char *)local_1038);
          std::terminate();
        }
        bVar12 = false;
        get_string_metadata_abi_cxx11_(local_1038,(dxil_spv *)node,(MDNode *)0x0,(uint)uVar11);
        pBVar7 = SPIRVModule::get_builder(local_1048->spirv_module);
        spv::Builder::addName
                  (pBVar7,local_1058.spec_constant_node_index,local_1038[0]._M_dataplus._M_p);
        iVar5 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
                compare(local_1038,local_1040);
        if (iVar5 == 0) {
          uVar3 = (local_1048->node_input).node_array_index;
          uVar6 = get_constant_metadata<unsigned_int>(node,1);
          bVar12 = uVar3 == uVar6;
        }
        local_1058.is_recursive = bVar12;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
             *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
          free_in_thread(local_1038[0]._M_dataplus._M_p);
        }
      }
      index = index + 2;
    } while (index < uVar10);
  }
  __position._M_current =
       (local_1048->node_outputs).
       super__Vector_base<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (local_1048->node_outputs).
      super__Vector_base<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<dxil_spv::Converter::Impl::NodeOutputMeta,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>>
    ::_M_realloc_insert<dxil_spv::Converter::Impl::NodeOutputMeta_const&>
              ((vector<dxil_spv::Converter::Impl::NodeOutputMeta,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>>
                *)&local_1048->node_outputs,__position,&local_1058);
  }
  else {
    (__position._M_current)->is_recursive = local_1058.is_recursive;
    *(undefined3 *)&(__position._M_current)->field_0x9 = local_1058._9_3_;
    (__position._M_current)->spec_constant_node_index = local_1058.spec_constant_node_index;
    (__position._M_current)->payload_stride = local_1058.payload_stride;
    ppNVar1 = &(local_1048->node_outputs).
               super__Vector_base<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_node_output(llvm::MDNode *output)
{
	NodeOutputMeta output_meta = {};

	bool is_rw_sharing;
	output_meta.payload_stride = node_parse_payload_stride(output, is_rw_sharing);
	output_meta.spec_constant_node_index = builder().makeUintConstant(0, true);
	builder().addDecoration(output_meta.spec_constant_node_index, spv::DecorationSpecId,
	                        int(NodeSpecIdOutputBase + node_outputs.size()));

	uint32_t num_ops = output->getNumOperands();
	for (uint32_t i = 0; i < num_ops; i += 2)
	{
		auto tag = DXIL::NodeMetadataTag(get_constant_metadata(output, i));
		if (tag == DXIL::NodeMetadataTag::NodeOutputID)
		{
			auto *output_node = llvm::cast<llvm::MDNode>(output->getOperand(i + 1));
			String name = get_string_metadata(output_node, 0);
			builder().addName(output_meta.spec_constant_node_index, name.c_str());

			// FIXME: This is probably not accurate for arrayed nodes.
			// Can recursive nodes be arrayed? Seems very spicy ...
			output_meta.is_recursive =
				name == node_input.node_id &&
				node_input.node_array_index == get_constant_metadata(output_node, 1);
		}
	}

	node_outputs.push_back(output_meta);
	return true;
}